

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O1

void pztopology::TPZPrism::TShape<double>
               (TPZVec<double> *loc,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  pdVar3 = loc->fStore;
  dVar1 = *pdVar3;
  dVar2 = pdVar3[1];
  dVar7 = pdVar3[2];
  dVar10 = (1.0 - dVar1) - dVar2;
  dVar8 = dVar10 * 0.5;
  dVar9 = 1.0 - dVar7;
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *phi->fElem = dVar8 * dVar9;
  dVar5 = dVar1 * 0.5;
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  phi->fElem[1] = dVar5 * dVar9;
  dVar6 = dVar2 * 0.5;
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  phi->fElem[2] = dVar6 * dVar9;
  dVar7 = dVar7 + 1.0;
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 4) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  phi->fElem[3] = dVar8 * dVar7;
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 5) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  phi->fElem[4] = dVar5 * dVar7;
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 6) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  phi->fElem[5] = dVar6 * dVar7;
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *dphi->fElem = dVar9 * -0.5;
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  dphi->fElem[1] = dVar9 * -0.5;
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  dphi->fElem[2] = dVar10 * -0.5;
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  dphi->fElem[lVar4] = dVar9 * 0.5;
  if ((lVar4 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  dphi->fElem[lVar4 + 1] = 0.0;
  if ((lVar4 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  dphi->fElem[lVar4 + 2] = dVar1 * -0.5;
  if ((lVar4 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  dphi->fElem[lVar4 * 2] = 0.0;
  if ((lVar4 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  dphi->fElem[lVar4 * 2 + 1] = dVar9 * 0.5;
  if ((lVar4 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  dphi->fElem[lVar4 * 2 + 2] = dVar2 * -0.5;
  if ((0 < lVar4) && (3 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dphi->fElem[lVar4 * 3] = dVar7 * -0.5;
    if ((lVar4 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dphi->fElem[lVar4 * 3 + 1] = dVar7 * -0.5;
    if ((lVar4 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dphi->fElem[lVar4 * 3 + 2] = dVar8;
    if ((lVar4 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dphi->fElem[lVar4 * 4] = dVar7 * 0.5;
    if ((lVar4 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dphi->fElem[lVar4 * 4 + 1] = 0.0;
    if ((lVar4 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dphi->fElem[lVar4 * 4 + 2] = dVar5;
    if ((lVar4 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 6)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dphi->fElem[lVar4 * 5] = 0.0;
    if ((lVar4 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 6)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dphi->fElem[lVar4 * 5 + 1] = dVar7 * 0.5;
    if ((2 < lVar4) && (5 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
      dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 5 + 2] = dVar6;
      return;
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

inline void TPZPrism::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
        T qsi = loc[0], eta = loc[1] , zeta  = loc[2];

        phi(0,0)  = .5*(1.-qsi-eta)*(1.-zeta);
        phi(1,0)  = .5*qsi*(1.-zeta);
        phi(2,0)  = .5*eta*(1.-zeta);
        phi(3,0)  = .5*(1.-qsi-eta)*(1.+zeta);
        phi(4,0)  = .5*qsi*(1.+zeta);
        phi(5,0)  = .5*eta*(1.+zeta);

        dphi(0,0) = -.5*(1.-zeta);
        dphi(1,0) = -.5*(1.-zeta);
        dphi(2,0) = -.5*(1.-qsi-eta);
        dphi(0,1) =  .5*(1.-zeta);
        dphi(1,1) =  .0;
        dphi(2,1) = -.5*qsi;
        dphi(0,2) =  .0;
        dphi(1,2) =  .5*(1.-zeta);
        dphi(2,2) = -.5*eta;
        dphi(0,3) = -.5*(1.+zeta);
        dphi(1,3) = -.5*(1.+zeta);
        dphi(2,3) =  .5*(1.-qsi-eta);
        dphi(0,4) =  .5*(1.+zeta);
        dphi(1,4) =  .0;
        dphi(2,4) =  .5*qsi;
        dphi(0,5) =  .0;
        dphi(1,5) =  .5*(1.+zeta);
        dphi(2,5) =  .5*eta;

    }